

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  basic_format_specs<wchar_t> *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  format_specs local_b8;
  ulong local_98;
  ulong uStack_90;
  wchar_t local_88 [4];
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<3>_>
  local_78;
  
  local_78.f.abs_value._0_8_ = (ulong)this->abs_value;
  local_78.f.abs_value._8_8_ = *(ulong *)((long)&this->abs_value + 8);
  lVar5 = 0;
  uVar6 = local_78.f.abs_value._8_8_;
  uVar7 = (ulong)local_78.f.abs_value;
  do {
    uVar3 = uVar6 << 0x3d;
    lVar5 = lVar5 + 1;
    bVar8 = 7 < uVar7;
    bVar9 = uVar6 != 0;
    uVar4 = -uVar6;
    uVar6 = uVar6 >> 3;
    uVar7 = uVar3 | uVar7 >> 3;
  } while (bVar9 || uVar4 < bVar8);
  pbVar2 = this->specs;
  local_78.f.num_digits = (int)lVar5;
  if (((char)pbVar2->field_0x9 < '\0') &&
     (((ulong)local_78.f.abs_value != 0 || local_78.f.abs_value._8_8_ != 0) &&
      pbVar2->precision <= local_78.f.num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  local_78.prefix.size_ = (size_t)this->prefix_size;
  local_b8.width = pbVar2->width;
  local_b8.precision = pbVar2->precision;
  uStack_90._0_1_ = pbVar2->type;
  uStack_90._1_3_ = *(undefined3 *)&pbVar2->field_0x9;
  uStack_90._4_4_ = (pbVar2->fill).data_[0];
  local_b8.fill.data_._4_8_ = *(undefined8 *)((pbVar2->fill).data_ + 1);
  local_b8.fill._12_8_ = *(undefined8 *)((pbVar2->fill).data_ + 3);
  local_78.size_ = local_78.prefix.size_ + lVar5;
  local_b8._9_1_ = SUB31(uStack_90._1_3_,0);
  local_78.fill = uStack_90._4_4_;
  if ((local_b8._9_1_ & 0xf) == 4) {
    uVar6 = local_b8._0_8_ & 0xffffffff;
    local_78.padding = 0;
    if (local_78.size_ <= uVar6) {
      local_78.padding = uVar6 - local_78.size_;
      local_78.size_ = uVar6;
    }
  }
  else if (local_78.f.num_digits < (int)local_b8.precision) {
    local_78.padding = (ulong)(uint)(local_b8.precision - local_78.f.num_digits);
    local_78.size_ = (uint)local_b8.precision + local_78.prefix.size_;
    local_78.fill = L'0';
  }
  else {
    local_78.padding = 0;
  }
  local_b8._8_8_ = uStack_90;
  if ((uStack_90 & 0xf00) == 0) {
    local_b8._8_8_ = uStack_90 | 0x200;
  }
  local_78.prefix.data_ = this->prefix;
  local_98 = local_b8._0_8_;
  local_88._0_8_ = local_b8.fill.data_._4_8_;
  local_88._8_8_ = local_b8.fill._12_8_;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,&local_b8,&local_78);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }